

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.c
# Opt level: O1

void Macro_smpsModSet(uint arg_count,long *arg_array)

{
  uchar byte;
  
  if (3 < arg_count) {
    MemoryStream_WriteByte(output_stream,0xf0);
    if (source_driver < 3 && 2 < target_driver) {
      MemoryStream_WriteByte(output_stream,(char)*arg_array + '\x01');
      MemoryStream_WriteByte(output_stream,(uchar)arg_array[1]);
      MemoryStream_WriteByte(output_stream,(uchar)arg_array[2]);
      byte = ((char)(int)arg_array[3] + '\x01') * (char)(int)arg_array[1];
    }
    else if (source_driver < 3 || 2 < target_driver) {
      MemoryStream_WriteByte(output_stream,(uchar)*arg_array);
      MemoryStream_WriteByte(output_stream,(uchar)arg_array[1]);
      MemoryStream_WriteByte(output_stream,(uchar)arg_array[2]);
      byte = (uchar)arg_array[3];
    }
    else {
      MemoryStream_WriteByte(output_stream,(uchar)*arg_array + 0xff);
      MemoryStream_WriteByte(output_stream,(uchar)arg_array[1]);
      MemoryStream_WriteByte(output_stream,(uchar)arg_array[2]);
      byte = (char)(((uint)(*(uint *)(arg_array + 3) == 0) << 8 | *(uint *)(arg_array + 3)) /
                   ((uint)(*(uint *)(arg_array + 1) == 0) << 8 | *(uint *)(arg_array + 1))) + 0xff;
    }
    MemoryStream_WriteByte(output_stream,byte);
    return;
  }
  __assert_fail("arg_count >= 4",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Clownacy[P]smps2asm2bin/instruction.c"
                ,0x2d4,"void Macro_smpsModSet(unsigned int, long *)");
}

Assistant:

static void Macro_smpsModSet(unsigned int arg_count, long arg_array[])
{
	assert(arg_count >= 4);

	WriteByte(0xF0);

	if (target_driver >= 3 && source_driver < 3)
	{
		WriteByte(arg_array[0] + 1);	// Wait
		WriteByte(arg_array[1]);	// Speed
		WriteByte(arg_array[2]);	// Change
		WriteByte(((arg_array[3] + 1) * arg_array[1]) & 0xFF);	// Step
	}
	else if (target_driver < 3 && source_driver >= 3)
	{
		WriteByte(arg_array[0] - 1);	// Wait
		WriteByte(arg_array[1]);	// Speed
		WriteByte(arg_array[2]);	// Change
		WriteByte(conv0To256(arg_array[3]) / conv0To256(arg_array[1]) - 1);	// Step
	}
	else
	{
		WriteByte(arg_array[0]);	// Wait
		WriteByte(arg_array[1]);	// Speed
		WriteByte(arg_array[2]);	// Change
		WriteByte(arg_array[3]);	// Step
	}
}